

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

par_shapes_mesh * par_shapes_create_disk(float radius,int slices,float *center,float *normal)

{
  int iVar1;
  long lVar2;
  float fVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  par_shapes_mesh *mesh;
  float *pfVar7;
  uint16_t *puVar8;
  uint16_t uVar9;
  int iVar10;
  long *in_FS_OFFSET;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float axis [3];
  undefined8 local_108;
  char *pcStack_100;
  undefined8 local_f8;
  float *local_f0;
  undefined8 local_e8;
  long lStack_e0;
  undefined4 local_d8;
  char *local_d0;
  char *pcStack_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  long lStack_b0;
  undefined4 local_a8;
  char *local_a0;
  char *pcStack_98;
  undefined8 local_90;
  undefined8 local_88;
  long lStack_80;
  undefined4 local_78;
  char *local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  long local_40;
  code *local_38;
  
  lVar2 = *in_FS_OFFSET + -0x430;
  local_40 = in_FS_OFFSET[-0x86];
  local_38 = (code *)in_FS_OFFSET[-0x85];
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_100 = "rf_calloc_wrapper";
  local_f8 = 0x27;
  local_58 = 0;
  uStack_50 = 0x30;
  local_48 = 0;
  local_f0 = center;
  mesh = (par_shapes_mesh *)(*local_38)(&local_40,1);
  mesh->points = (float *)0x0;
  *(undefined8 *)&mesh->npoints = 0;
  mesh->triangles = (uint16_t *)0x0;
  *(undefined8 *)&mesh->ntriangles = 0;
  mesh->normals = (float *)0x0;
  mesh->tcoords = (float *)0x0;
  mesh->npoints = slices + 1;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_68 = "par_shapes_create_disk";
  local_60 = 0x6135;
  local_88 = 0;
  lStack_80 = (long)((slices + 1) * 3) << 2;
  local_78 = 0;
  pfVar7 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->points = pfVar7;
  pfVar7[0] = 0.0;
  pfVar7[1] = 0.0;
  pfVar7[2] = 0.0;
  if (0 < slices) {
    pfVar7 = pfVar7 + 5;
    dVar6 = 0.0;
    iVar10 = slices;
    do {
      dVar4 = (double)(float)((dVar6 * 3.14159265359 + dVar6 * 3.14159265359) / (double)slices);
      dVar5 = cos(dVar4);
      pfVar7[-2] = (float)(dVar5 * (double)radius);
      dVar4 = sin(dVar4);
      pfVar7[-1] = (float)(dVar4 * (double)radius);
      *pfVar7 = 0.0;
      dVar6 = dVar6 + 1.0;
      pfVar7 = pfVar7 + 3;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  fVar13 = *normal;
  fVar14 = normal[1];
  fVar3 = normal[2];
  fVar11 = fVar3 * fVar3 + fVar13 * fVar13 + fVar14 * fVar14;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  fVar12 = 1.0 / fVar11;
  if (0.0 < fVar11) {
    fVar13 = fVar13 * fVar12;
    fVar14 = fVar14 * fVar12;
  }
  fVar3 = (float)(~-(uint)(0.0 < fVar11) & (uint)fVar3 |
                 (uint)(fVar3 * fVar12) & -(uint)(0.0 < fVar11));
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_98 = "par_shapes_create_disk";
  local_90 = 0x6142;
  local_b8 = 0;
  lStack_b0 = (long)mesh->npoints * 0xc;
  local_a8 = 0;
  pfVar7 = (float *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->normals = pfVar7;
  iVar10 = mesh->npoints;
  if (0 < iVar10) {
    do {
      *pfVar7 = fVar13;
      pfVar7[1] = fVar14;
      pfVar7[2] = fVar3;
      pfVar7 = pfVar7 + 3;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  mesh->ntriangles = slices;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
  ;
  pcStack_c8 = "par_shapes_create_disk";
  local_c0 = 0x614a;
  local_e8 = 0;
  lStack_e0 = (long)(slices * 3) * 2;
  local_d8 = 0;
  puVar8 = (uint16_t *)(*(code *)in_FS_OFFSET[-0x85])(lVar2,1);
  mesh->triangles = puVar8;
  if (0 < slices) {
    iVar10 = 0;
    do {
      *puVar8 = 0;
      iVar1 = iVar10 + 1;
      puVar8[1] = (uint16_t)iVar1;
      uVar9 = (short)iVar10 + 2;
      if (iVar10 - slices == -1) {
        uVar9 = 1;
      }
      puVar8[2] = uVar9;
      puVar8 = puVar8 + 3;
      iVar10 = iVar1;
    } while (iVar1 != slices);
  }
  fVar11 = fVar3 * -0.0 - fVar14;
  fVar12 = fVar3 * 0.0 + fVar13;
  fVar14 = fVar13 * 0.0 + fVar14 * -0.0;
  local_108 = (char *)CONCAT44(fVar12,fVar11);
  fVar13 = fVar14 * fVar14 + fVar11 * fVar11 + fVar12 * fVar12;
  pcStack_100._0_4_ = fVar14;
  if (fVar13 < 0.0) {
    fVar13 = sqrtf(fVar13);
  }
  else {
    fVar13 = SQRT(fVar13);
  }
  if (0.0 < fVar13) {
    fVar13 = 1.0 / fVar13;
    local_108 = (char *)CONCAT44(fVar12 * fVar13,fVar11 * fVar13);
    pcStack_100._0_4_ = fVar14 * fVar13;
  }
  dVar6 = acos((double)fVar3);
  par_shapes_rotate(mesh,(float)dVar6,(float *)&local_108);
  iVar10 = mesh->npoints;
  if (0 < iVar10) {
    fVar13 = *local_f0;
    fVar14 = local_f0[1];
    fVar3 = local_f0[2];
    pfVar7 = mesh->points;
    do {
      *pfVar7 = *pfVar7 + fVar13;
      pfVar7[1] = pfVar7[1] + fVar14;
      pfVar7[2] = pfVar7[2] + fVar3;
      pfVar7 = pfVar7 + 3;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
  }
  return mesh;
}

Assistant:

PARDEF par_shapes_mesh* par_shapes_create_disk(float radius, int slices,
                                        float const* center, float const* normal)
{
    par_shapes_mesh* mesh = PAR_CALLOC(par_shapes_mesh, 1);
    mesh->npoints = slices + 1;
    mesh->points = PAR_MALLOC(float, 3 * mesh->npoints);
    float* points = mesh->points;
    *points++ = 0;
    *points++ = 0;
    *points++ = 0;
    for (int i = 0; i < slices; i++) {
        float theta = i * PAR_PI * 2 / slices;
        *points++ = radius * cos(theta);
        *points++ = radius * sin(theta);
        *points++ = 0;
    }
    float nnormal[3] = {normal[0], normal[1], normal[2]};
    par_shapes__normalize3(nnormal);
    mesh->normals = PAR_MALLOC(float, 3 * mesh->npoints);
    float* norms = mesh->normals;
    for (int i = 0; i < mesh->npoints; i++) {
        *norms++ = nnormal[0];
        *norms++ = nnormal[1];
        *norms++ = nnormal[2];
    }
    mesh->ntriangles = slices;
    mesh->triangles = PAR_MALLOC(PAR_SHAPES_T, 3 * mesh->ntriangles);
    PAR_SHAPES_T* triangles = mesh->triangles;
    for (int i = 0; i < slices; i++) {
        *triangles++ = 0;
        *triangles++ = 1 + i;
        *triangles++ = 1 + (i + 1) % slices;
    }
    float k[3] = {0, 0, -1};
    float axis[3];
    par_shapes__cross3(axis, nnormal, k);
    par_shapes__normalize3(axis);
    par_shapes_rotate(mesh, acos(nnormal[2]), axis);
    par_shapes_translate(mesh, center[0], center[1], center[2]);
    return mesh;
}